

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

Am_Wrapper * get_button_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_40 [8];
  Am_Value value;
  Am_Object local_20;
  Am_Object widget;
  Am_Object *self_local;
  
  widget.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_40);
    in_value = Am_Object::Peek(&local_20,0x169,0);
    Am_Value::operator=((Am_Value *)local_40,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_40);
    if (bVar1) {
      self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
    }
    Am_Value::~Am_Value((Am_Value *)local_40);
    if (bVar1) goto LAB_00357bb5;
  }
  self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
LAB_00357bb5:
  Am_Object::~Am_Object(&local_20);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Object_Formula(get_button_widget_value)
{
  Am_Object widget = self.Get_Owner(); // widget the interactor is in
  if (widget.Valid()) {
    Am_Value value;
    value = widget.Peek(Am_VALUE);
    if (value.Valid())
      return widget;
  }
  return Am_No_Object;
}